

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O0

IterateResult __thiscall
gl4cts::DirectStateAccess::Framebuffers::InvalidateDataAndSubDataErrorsTest::iterate
          (InvalidateDataAndSubDataErrorsTest *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  int iVar12;
  ContextType ctxType;
  ApiType requiredApiType;
  RenderContext *pRVar13;
  undefined4 extraout_var;
  ContextInfo *this_00;
  bool is_error;
  bool is_ok;
  bool is_arb_direct_state_access;
  bool is_at_least_gl_45;
  Functions *gl;
  InvalidateDataAndSubDataErrorsTest *this_local;
  long lVar14;
  
  pRVar13 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar12 = (*pRVar13->_vptr_RenderContext[3])();
  lVar14 = CONCAT44(extraout_var,iVar12);
  pRVar13 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  ctxType.super_ApiType.m_bits = (ApiType)(*pRVar13->_vptr_RenderContext[2])();
  requiredApiType = glu::ApiType::core(4,5);
  bVar1 = glu::contextSupports(ctxType,requiredApiType);
  this_00 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  bVar2 = glu::ContextInfo::isExtensionSupported(this_00,"GL_ARB_direct_state_access");
  if ((bVar1) || (bVar2)) {
    PrepareObjects(this);
    (**(code **)(lVar14 + 0xc40))(this->m_fbo_invalid,1,&this->m_fbo_attachment_valid);
    bVar1 = ExpectError(this,0x502,"InvalidateNamedFramebufferData",
                        "framebuffer is not zero or the name of an existing framebuffer object.");
    (**(code **)(lVar14 + 0xc40))(this->m_fbo_valid,1,&this->m_fbo_attachment_invalid);
    bVar2 = ExpectError(this,0x500,"InvalidateNamedFramebufferData",
                        "a framebuffer object is affected, and any element of of attachments is not one of the values in table { COLOR_ATTACHMENTi, DEPTH_ATTACHMENT, STENCIL_ATTACHMENT, DEPTH_STENCIL_ATTACHMENT }."
                       );
    (**(code **)(lVar14 + 0xc40))(this->m_fbo_valid,1,&this->m_color_attachment_invalid);
    bVar3 = ExpectError(this,0x502,"InvalidateNamedFramebufferData",
                        "attachments contains COLOR_ATTACHMENTm where m is greater than or equal to the value of MAX_COLOR_ATTACHMENTS"
                       );
    (**(code **)(lVar14 + 0xc40))(0,1,&this->m_default_attachment_invalid);
    bVar4 = ExpectError(this,0x500,"InvalidateNamedFramebufferData",
                        "the default framebuffer is affected, and any elements of attachments are not one of FRONT_LEFT, FRONT_RIGHT, BACK_LEFT, BACK_RIGHT, COLOR, DEPTH, STENCIL."
                       );
    (**(code **)(lVar14 + 0xc48))(this->m_fbo_invalid,1,&this->m_fbo_attachment_valid,0,0,1,1);
    bVar5 = ExpectError(this,0x502,"InvalidateNamedFramebufferSubData",
                        "framebuffer is not zero or the name of an existing framebuffer object.");
    (**(code **)(lVar14 + 0xc48))
              (this->m_fbo_valid,0xffffffff,&this->m_fbo_attachment_valid,0,0,1,1);
    bVar6 = ExpectError(this,0x501,"InvalidateNamedFramebufferSubData","numAttachments is negative."
                       );
    (**(code **)(lVar14 + 0xc48))
              (this->m_fbo_valid,1,&this->m_fbo_attachment_valid,0,0,0xffffffff,1);
    bVar7 = ExpectError(this,0x501,"InvalidateNamedFramebufferSubData","width is negative.");
    (**(code **)(lVar14 + 0xc48))
              (this->m_fbo_valid,1,&this->m_fbo_attachment_valid,0,0,1,0xffffffff);
    bVar8 = ExpectError(this,0x501,"InvalidateNamedFramebufferSubData","height is negative.");
    (**(code **)(lVar14 + 0xc48))(this->m_fbo_valid,1,&this->m_fbo_attachment_invalid,0,0,1,1);
    bVar9 = ExpectError(this,0x500,"InvalidateNamedFramebufferSubData",
                        "a framebuffer object is affected, and any element of of attachments is not one of the values in table { COLOR_ATTACHMENTi, DEPTH_ATTACHMENT, STENCIL_ATTACHMENT, DEPTH_STENCIL_ATTACHMENT }."
                       );
    (**(code **)(lVar14 + 0xc48))(this->m_fbo_valid,1,&this->m_color_attachment_invalid,0,0,1,1);
    bVar10 = ExpectError(this,0x502,"InvalidateNamedFramebufferSubData",
                         "attachments contains COLOR_ATTACHMENTm where m is greater than or equal to the value of MAX_COLOR_ATTACHMENTS"
                        );
    (**(code **)(lVar14 + 0xc48))(0,1,&this->m_default_attachment_invalid,0,0,1,1);
    bVar11 = ExpectError(this,0x500,"InvalidateNamedFramebufferSubData",
                         "the default framebuffer is affected, and any elements of attachments are not one of FRONT_LEFT, FRONT_RIGHT, BACK_LEFT, BACK_RIGHT, COLOR, DEPTH, STENCIL."
                        );
    Clean(this);
    if ((bVar10 &&
        (bVar9 && (bVar8 && (bVar7 && (bVar6 && (bVar5 && (bVar4 && (bVar3 && (bVar2 && bVar1)))))))
        )) && bVar11) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Fail");
    }
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_NOT_SUPPORTED,"Not Supported");
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult InvalidateDataAndSubDataErrorsTest::iterate()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	try
	{
		/* Prepare objects. */
		PrepareObjects();

		/******* InvalidateNamedFramebufferData *******/

		/*  Check that INVALID_OPERATION error is generated by InvalidateNamedFramebufferData if framebuffer is not zero or the name of an existing framebuffer object. */
		gl.invalidateNamedFramebufferData(m_fbo_invalid, 1, &m_fbo_attachment_valid);

		is_ok &= ExpectError(GL_INVALID_OPERATION, "InvalidateNamedFramebufferData",
							 "framebuffer is not zero or the name of an existing framebuffer object.");

		/*  Check that INVALID_ENUM error is generated by InvalidateNamedFramebufferData if a framebuffer object is affected, and
		 any element of of attachments is not one of the values in table {COLOR_ATTACHMENTi, DEPTH_ATTACHMENT, STENCIL_ATTACHMENT, DEPTH_STENCIL_ATTACHMENT }. */
		gl.invalidateNamedFramebufferData(m_fbo_valid, 1, &m_fbo_attachment_invalid);

		is_ok &= ExpectError(GL_INVALID_ENUM, "InvalidateNamedFramebufferData",
							 "a framebuffer object is affected, and any element of of attachments is not one of the "
							 "values in table { COLOR_ATTACHMENTi, DEPTH_ATTACHMENT, STENCIL_ATTACHMENT, "
							 "DEPTH_STENCIL_ATTACHMENT }.");

		/*  Check that INVALID_OPERATION error is generated by InvalidateNamedFramebufferData if attachments contains COLOR_ATTACHMENTm
		 where m is greater than or equal to the value of MAX_COLOR_ATTACHMENTS. */
		gl.invalidateNamedFramebufferData(m_fbo_valid, 1, &m_color_attachment_invalid);

		is_ok &= ExpectError(GL_INVALID_OPERATION, "InvalidateNamedFramebufferData",
							 "attachments contains COLOR_ATTACHMENTm where m is greater than or equal to the value of "
							 "MAX_COLOR_ATTACHMENTS");

		/*  Check that INVALID_ENUM error is generated by
		 InvalidateNamedFramebufferData if the default framebuffer is affected,
		 and any elements of attachments are not one of:
		 -  FRONT_LEFT, FRONT_RIGHT, BACK_LEFT, and BACK_RIGHT, identifying that
		 specific buffer,
		 -  COLOR, which is treated as BACK_LEFT for a double-buffered context
		 and FRONT_LEFT for a single-buffered context,
		 -  DEPTH, identifying the depth buffer,
		 -  STENCIL, identifying the stencil buffer. */
		gl.invalidateNamedFramebufferData(0, 1, &m_default_attachment_invalid);

		is_ok &= ExpectError(GL_INVALID_ENUM, "InvalidateNamedFramebufferData",
							 "the default framebuffer is affected, and any elements of attachments are not one of "
							 "FRONT_LEFT, FRONT_RIGHT, BACK_LEFT, BACK_RIGHT, COLOR, DEPTH, STENCIL.");

		/******* InvalidateNamedFramebufferSubData *******/

		/*  Check that INVALID_OPERATION error is generated by InvalidateNamedFramebufferSubData if framebuffer is not zero or the name of an existing framebuffer object. */
		gl.invalidateNamedFramebufferSubData(m_fbo_invalid, 1, &m_fbo_attachment_valid, 0, 0, 1, 1);

		is_ok &= ExpectError(GL_INVALID_OPERATION, "InvalidateNamedFramebufferSubData",
							 "framebuffer is not zero or the name of an existing framebuffer object.");

		/*  Check that INVALID_VALUE error is generated by InvalidateNamedFramebufferSubData if numAttachments, width, or height is negative. */
		gl.invalidateNamedFramebufferSubData(m_fbo_valid, -1, &m_fbo_attachment_valid, 0, 0, 1, 1);

		is_ok &= ExpectError(GL_INVALID_VALUE, "InvalidateNamedFramebufferSubData", "numAttachments is negative.");

		gl.invalidateNamedFramebufferSubData(m_fbo_valid, 1, &m_fbo_attachment_valid, 0, 0, -1, 1);

		is_ok &= ExpectError(GL_INVALID_VALUE, "InvalidateNamedFramebufferSubData", "width is negative.");

		gl.invalidateNamedFramebufferSubData(m_fbo_valid, 1, &m_fbo_attachment_valid, 0, 0, 1, -1);

		is_ok &= ExpectError(GL_INVALID_VALUE, "InvalidateNamedFramebufferSubData", "height is negative.");

		/*  Check that INVALID_ENUM error is generated by InvalidateNamedFramebufferSubData if a framebuffer object is affected, and
		 any element of of attachments is not one of the values in table {COLOR_ATTACHMENTi, DEPTH_ATTACHMENT, STENCIL_ATTACHMENT, DEPTH_STENCIL_ATTACHMENT }. */
		gl.invalidateNamedFramebufferSubData(m_fbo_valid, 1, &m_fbo_attachment_invalid, 0, 0, 1, 1);

		is_ok &= ExpectError(GL_INVALID_ENUM, "InvalidateNamedFramebufferSubData",
							 "a framebuffer object is affected, and any element of of attachments is not one of the "
							 "values in table { COLOR_ATTACHMENTi, DEPTH_ATTACHMENT, STENCIL_ATTACHMENT, "
							 "DEPTH_STENCIL_ATTACHMENT }.");

		/*  Check that INVALID_OPERATION error is generated by InvalidateNamedFramebufferSubData if attachments contains COLOR_ATTACHMENTm
		 where m is greater than or equal to the value of MAX_COLOR_ATTACHMENTS. */
		gl.invalidateNamedFramebufferSubData(m_fbo_valid, 1, &m_color_attachment_invalid, 0, 0, 1, 1);

		is_ok &= ExpectError(GL_INVALID_OPERATION, "InvalidateNamedFramebufferSubData",
							 "attachments contains COLOR_ATTACHMENTm where m is greater than or equal to the value of "
							 "MAX_COLOR_ATTACHMENTS");

		/*  Check that INVALID_ENUM error is generated by InvalidateNamedFramebufferSubData if the default framebuffer is affected,
		 and any elements of attachments are not one of:
		 -  FRONT_LEFT, FRONT_RIGHT, BACK_LEFT, and BACK_RIGHT, identifying that
		 specific buffer,
		 -  COLOR, which is treated as BACK_LEFT for a double-buffered context
		 and FRONT_LEFT for a single-buffered context,
		 -  DEPTH, identifying the depth buffer,
		 -  STENCIL, identifying the stencil buffer. */
		gl.invalidateNamedFramebufferSubData(0, 1, &m_default_attachment_invalid, 0, 0, 1, 1);

		is_ok &= ExpectError(GL_INVALID_ENUM, "InvalidateNamedFramebufferSubData",
							 "the default framebuffer is affected, and any elements of attachments are not one of "
							 "FRONT_LEFT, FRONT_RIGHT, BACK_LEFT, BACK_RIGHT, COLOR, DEPTH, STENCIL.");
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Cleanup. */
	Clean();

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}